

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

void __thiscall BpTree<int>::DeleteKey(BpTree<int> *this,int k,Addr p)

{
  Addr p_00;
  IndexNode<int> C;
  IndexNode<int> IStack_88;
  
  p_00 = FindLeafAddr(this,k,p);
  if ((ulong)p_00 < 0xffffffff00000000) {
    IndexNode<int>::IndexNode(&IStack_88,this->N);
    FindNode(this,p_00,&IStack_88);
    Delete_Aux(this,&IStack_88,k,p);
    IndexNode<int>::~IndexNode(&IStack_88);
  }
  return;
}

Assistant:

void BpTree<K>::DeleteKey(K k, Addr p) {
	Addr pos = this->FindLeafAddr(k, p);
	if (pos.FileOff != -1) {
		IndexNode<K> C(N);
		this->FindNode(pos, C);
		this->Delete_Aux(C, k, p);
	}
	else
		//cout << "Cannot find the key!" << endl;
	return;
}